

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

UInt64 __thiscall Json::Value::asUInt64(Value *this)

{
  double dVar1;
  bool bVar2;
  UInt64 UVar3;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  UVar3 = (UInt64)*(byte *)&this->bits_;
  switch(UVar3) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt64(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::operator<<((ostream *)local_180,"LargestInt out of UInt64 range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
  case 2:
    UVar3 = (this->value_).int_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (1.8446744073709552e+19 < dVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::operator<<((ostream *)local_180,"double out of UInt64 range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    UVar3 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"Value is not convertible to UInt64.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    UVar3 = (UInt64)(this->value_).bool_;
  }
  return UVar3;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}